

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O0

void kmlyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double ac;
  double a0;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->mix_coef[1] = 1.0 - dVar2;
  in_RDI->mix_coef[2] = dVar2;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
kmlyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ac;

  assert(p != NULL);

  a0 = get_ext_param(p, ext_params, 0);
  ac = get_ext_param(p, ext_params, 1);

  p->mix_coef[0] = 1.0 - a0;
  p->mix_coef[1] = 1.0 - ac;
  p->mix_coef[2] = ac;

  p->cam_alpha = a0;

}